

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O0

int matchplus(regex_t p,regex_t *pattern,char *text)

{
  int iVar1;
  bool bVar2;
  regex_t p_00;
  char *local_30;
  char *text_local;
  regex_t *pattern_local;
  regex_t p_local;
  
  p_00.field_1 = p.field_1;
  local_30 = text;
  while( true ) {
    bVar2 = false;
    if (*local_30 != '\0') {
      p_00._1_7_ = 0;
      p_00.type = p.type;
      iVar1 = matchone(p_00,*local_30);
      bVar2 = iVar1 != 0;
      local_30 = local_30 + 1;
    }
    if (!bVar2) break;
    iVar1 = matchpattern(pattern,local_30);
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int matchplus(regex_t p, regex_t* pattern, const char* text)
{
  while ((text[0] != '\0') && matchone(p, *text++))
  {
    if (matchpattern(pattern, text))
      return 1;
  }
  return 0;
}